

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O3

void __thiscall helics::apps::Echo::echoMessage(Echo *this,Endpoint *ept,Time currentTime)

{
  undefined8 __ptr;
  undefined8 uVar1;
  int iVar2;
  string_view dest;
  undefined1 local_40 [16];
  
  Endpoint::getMessage((Endpoint *)local_40);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->delayTimeLock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((Message *)local_40._0_8_ != (Message *)0x0) {
    do {
      dest._M_str = (((string *)(local_40._0_8_ + 0xb0))->_M_dataplus)._M_p;
      dest._M_len = ((string *)(local_40._0_8_ + 0xb0))->_M_string_length;
      Endpoint::sendToAt(ept,(char *)((SmallBuffer *)(local_40._0_8_ + 0x10))->heap,
                         ((SmallBuffer *)(local_40._0_8_ + 0x10))->bufferSize,dest,
                         (Time)((this->delayTime).internalTimeCode + currentTime.internalTimeCode));
      Endpoint::getMessage((Endpoint *)(local_40 + 8));
      uVar1 = local_40._8_8_;
      __ptr = local_40._0_8_;
      local_40._8_8_ = (Message *)0x0;
      local_40._0_8_ = uVar1;
      if (((Message *)__ptr != (Message *)0x0) &&
         (CLI::std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)local_40,(Message *)__ptr),
         (Message *)local_40._8_8_ != (Message *)0x0)) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)(local_40 + 8),(Message *)local_40._8_8_);
      }
    } while ((Message *)local_40._0_8_ != (Message *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->delayTimeLock);
  if ((Message *)local_40._0_8_ != (Message *)0x0) {
    CLI::std::default_delete<helics::Message>::operator()
              ((default_delete<helics::Message> *)local_40,(Message *)local_40._0_8_);
  }
  return;
}

Assistant:

void Echo::echoMessage(const Endpoint& ept, Time currentTime)
    {
        auto m = ept.getMessage();
        std::lock_guard<std::mutex> lock(delayTimeLock);
        while (m) {
            ept.sendToAt(m->data, m->original_source, currentTime + delayTime);
            m = ept.getMessage();
        }
    }